

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::~ImFontAtlas(ImFontAtlas *this)

{
  if (this->Locked != true) {
    Clear(this);
    ImVector<ImFontConfig>::~ImVector(&this->ConfigData);
    ImVector<ImFontAtlasCustomRect>::~ImVector(&this->CustomRects);
    ImVector<ImFont_*>::~ImVector(&this->Fonts);
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x649,"ImFontAtlas::~ImFontAtlas()");
}

Assistant:

ImFontAtlas::~ImFontAtlas()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    Clear();
}